

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockMatcher.cpp
# Opt level: O1

void __thiscall StockMatcher::executeMatching(StockMatcher *this)

{
  MatchingEngine *this_00;
  pointer pcVar1;
  orderType oVar2;
  ulong uVar3;
  long lVar4;
  pointer pbVar5;
  string textLine;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  messageStatus;
  tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
  message;
  Order order;
  string local_f8;
  char local_d8;
  string local_d0;
  undefined1 local_b0 [40];
  bool local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  OrderValidator *local_60;
  Order local_58;
  
  this_00 = &this->m_stockMatchEngine;
  MatchingEngine::setOutPutStream(this_00);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  pbVar5 = (this->m_cachedStream).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 != (this->m_cachedStream).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = (OrderValidator *)&this->field_0x20;
    lVar4 = -1;
    uVar3 = 1;
    do {
      std::__cxx11::string::_M_assign((string *)&local_f8);
      if (local_f8._M_string_length != 0) {
        OrderValidator::validateOrder
                  ((tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
                    *)local_b0,local_60,&local_f8);
        local_d8 = local_88;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_80._M_p,local_80._M_p + local_78);
        if (local_d8 == '\x01') {
          Order::Order(&local_58,(Order *)local_b0);
          oVar2 = Order::getOrderType(&local_58);
          if (oVar2 == buyOrder) {
            MatchingEngine::addIntoBuyQueue(this_00,(function<void_()> *)&local_58);
          }
          else {
            MatchingEngine::addIntoSellQueue(this_00,(function<void_()> *)&local_58);
          }
          MatchingEngine::runMatching(this_00);
        }
        else {
          MatchingEngine::pushInBadOrder(this_00,&local_f8,&local_d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
      }
      if ((uVar3 / 10) * 10 + lVar4 == 0) {
        MatchingEngine::displayOrderBook(this_00);
      }
      pbVar5 = pbVar5 + 1;
      lVar4 = lVar4 + -1;
      uVar3 = uVar3 + 1;
    } while (pbVar5 != (this->m_cachedStream).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Bad order summary : ","");
  MatchingEngine::writeToLog(this_00,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  MatchingEngine::displayBadOrders(this_00);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Final queue summary : ","");
  MatchingEngine::writeToLog(this_00,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  MatchingEngine::displayOrderBook(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void StockMatcher::executeMatching()
{
	m_stockMatchEngine.setOutPutStream();
    std::string textLine;
    long lineCount = 0;
    auto cacheIter = m_cachedStream.begin();
    while(cacheIter != m_cachedStream.end())
    {
        textLine = *cacheIter;
        lineCount++;
        if(textLine.length()>0)
        {
            std::tuple<std::pair<bool,std::string>,Order> message = m_validator.validateOrder(textLine);
            std::pair<bool,std::string> messageStatus = std::get<0>(message);
            bool status = messageStatus.first;
            if(status)
            {
                Order order = std::get<1>(message);
                if(order.getOrderType() == orderType::buyOrder)
                {
                    m_stockMatchEngine.addIntoBuyQueue(order);
                }
                else
                {
                    m_stockMatchEngine.addIntoSellQueue(order);
                }
                // Now run the stockMatching engine.
                m_stockMatchEngine.runMatching();
            }
            else
            {
                m_stockMatchEngine.pushInBadOrder(textLine, messageStatus.second);
            }
        }

        // There is a need every 10th Message to print the buy and sell queues. do that here.
        if(lineCount%10 == 0)
            m_stockMatchEngine.displayOrderBook();

        cacheIter++;
    }

    // Display a final summary of any bad orders at the end of execution.
    m_stockMatchEngine.writeToLog("Bad order summary : ");
    m_stockMatchEngine.displayBadOrders();
    m_stockMatchEngine.writeToLog("Final queue summary : ");
    m_stockMatchEngine.displayOrderBook();
}